

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebyshevII.cpp
# Opt level: O1

void __thiscall
Iir::ChebyshevII::AnalogLowShelf::design
          (AnalogLowShelf *this,int numPoles,double gainDb,double stopBandDb)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  double dVar9;
  ulong uVar10;
  double local_a8;
  complex_t local_58;
  complex_t local_48;
  
  if (this->m_numPoles == numPoles) {
    if ((this->m_stopBandDb == stopBandDb) && (!NAN(this->m_stopBandDb) && !NAN(stopBandDb))) {
      if ((this->m_gainDb == gainDb) && (!NAN(this->m_gainDb) && !NAN(gainDb))) {
        return;
      }
    }
  }
  this->m_numPoles = numPoles;
  this->m_stopBandDb = stopBandDb;
  this->m_gainDb = gainDb;
  (this->super_LayoutBase).m_numPoles = 0;
  uVar8 = -(ulong)(ABS(gainDb) <= stopBandDb);
  uVar10 = ~uVar8 & (ulong)stopBandDb | (ulong)ABS(gainDb) & uVar8;
  uVar8 = -(ulong)(-gainDb < gainDb);
  local_a8 = (double)((uVar10 ^ 0x8000000000000000) & uVar8 | ~uVar8 & uVar10);
  dVar1 = pow(10.0,gainDb / -20.0);
  dVar2 = pow(10.0,(-gainDb - local_a8) / 20.0);
  if ((dVar2 != 1.0) || (NAN(dVar2))) {
    dVar3 = (dVar1 * dVar1 + -dVar2 * dVar2) / (dVar2 * dVar2 + -1.0);
    if (dVar3 < 0.0) {
      dVar3 = sqrt(dVar3);
    }
    else {
      dVar3 = SQRT(dVar3);
    }
  }
  else {
    dVar3 = dVar1 + -1.0;
  }
  dVar9 = 1.0 / (dVar3 * dVar3) + 1.0;
  dVar4 = SQRT(dVar9);
  dVar5 = dVar4;
  if (dVar9 < 0.0) {
    dVar5 = sqrt(dVar9);
  }
  dVar1 = pow(dVar2 * dVar5 + dVar1 / dVar3,1.0 / (double)numPoles);
  dVar1 = log(dVar1);
  if (dVar9 < 0.0) {
    dVar4 = sqrt(dVar9);
  }
  dVar2 = pow(1.0 / dVar3 + dVar4,1.0 / (double)numPoles);
  dVar2 = log(dVar2);
  dVar3 = sinh(dVar1);
  dVar4 = sinh(dVar2);
  dVar1 = cosh(dVar1);
  dVar2 = cosh(dVar2);
  if (1 < numPoles) {
    uVar6 = (uint)numPoles >> 1;
    iVar7 = 1;
    do {
      dVar5 = ((double)iVar7 * 3.141592653589793) / (double)(numPoles * 2);
      dVar9 = sin(dVar5);
      dVar5 = cos(dVar5);
      local_48._M_value._8_4_ = SUB84(dVar1 * dVar5,0);
      local_48._M_value._0_8_ = dVar3 * -dVar9;
      local_48._M_value._12_4_ = (int)((ulong)(dVar1 * dVar5) >> 0x20);
      local_58._M_value._8_4_ = SUB84(dVar5 * dVar2,0);
      local_58._M_value._0_8_ = -dVar9 * dVar4;
      local_58._M_value._12_4_ = (int)((ulong)(dVar5 * dVar2) >> 0x20);
      LayoutBase::addPoleZeroConjugatePairs(&this->super_LayoutBase,&local_48,&local_58);
      iVar7 = iVar7 + 2;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  if ((numPoles & 1U) != 0) {
    local_48._M_value._8_8_ = 0;
    local_48._M_value._0_8_ = -dVar3;
    local_58._M_value._8_8_ = 0;
    local_58._M_value._0_8_ = -dVar4;
    LayoutBase::add(&this->super_LayoutBase,&local_48,&local_58);
  }
  return;
}

Assistant:

void AnalogLowShelf::design (int numPoles,
                             double gainDb,
                             double stopBandDb)
{
  if (m_numPoles != numPoles ||
      m_stopBandDb != stopBandDb ||
      m_gainDb != gainDb)
  {
    m_numPoles = numPoles;
    m_stopBandDb = stopBandDb;
    m_gainDb = gainDb;

    reset ();

    gainDb = -gainDb;

    if (stopBandDb >= fabs(gainDb))
      stopBandDb = fabs (gainDb);
    if (gainDb<0)
      stopBandDb = -stopBandDb;

    const double G  = std::pow (10., gainDb / 20.0 );
    const double Gb = std::pow (10., (gainDb - stopBandDb) / 20.0);
    const double G0 = 1;
    const double g0 = pow (G0 , 1. / numPoles);

    double eps;
    if (Gb != G0 )
      eps = sqrt((G*G-Gb*Gb)/(Gb*Gb-G0*G0));
    else
      eps = G-1; // This is surely wrong

    const double b = pow (G/eps+Gb*sqrt(1+1/(eps*eps)), 1./numPoles);
    const double u = log (b / g0);
    const double v = log (pow (1. / eps+sqrt(1+1/(eps*eps)),1./numPoles));
    
    const double sinh_u = sinh (u);
    const double sinh_v = sinh (v);
    const double cosh_u = cosh (u);
    const double cosh_v = cosh (v);
    const double n2 = 2 * numPoles;
    const int pairs = numPoles / 2;
    for (int i = 1; i <= pairs; ++i)
    {
      const double a = doublePi * (2 * i - 1) / n2;
      const double sn = sin (a);
      const double cs = cos (a);
      addPoleZeroConjugatePairs (complex_t (-sn * sinh_u, cs * cosh_u),
                                       complex_t (-sn * sinh_v, cs * cosh_v));
    }

    if (numPoles & 1)
      add (-sinh_u, -sinh_v);
  }
}